

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O3

void __thiscall OmegaOP::algoISOTONIC(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  double **ppdVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  double dVar19;
  Costs cost;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  double local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double theV;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  double *local_48;
  double local_40;
  ulong local_38;
  
  uVar7 = (ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar10 = this->nbStates;
  uVar16 = (ulong)uVar10;
  Costs::Costs(&cost);
  ppdVar4 = preprocessing(this,data);
  this->S12P = ppdVar4;
  uVar17 = (int)uVar7 + 1;
  uVar15 = (ulong)uVar17;
  local_68 = uVar7;
  pvVar5 = operator_new__(uVar15 * 4);
  pvVar6 = operator_new__(uVar15 * 4);
  theV = 0.0;
  local_a0 = 2;
  dVar19 = 0.0;
  local_58 = uVar15;
  if (2 < uVar17) {
    local_88 = (ulong)(uVar10 - 1);
    local_60 = local_88 - 1;
    uVar10 = 1;
    uVar7 = 0;
    local_80 = uVar16;
    local_50 = pvVar5;
    do {
      ppdVar4 = this->Q;
      uVar15 = (ulong)uVar10;
      uVar11 = 0;
      do {
        if (local_88 == uVar11) {
          iVar9 = (int)local_88;
          goto LAB_00108404;
        }
        ppdVar1 = ppdVar4 + uVar11;
        lVar18 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while (ppdVar4[lVar18][uVar15] <= (*ppdVar1)[uVar15] &&
               (*ppdVar1)[uVar15] != ppdVar4[lVar18][uVar15]);
      iVar9 = (int)uVar11 + -1;
LAB_00108404:
      *(int *)((long)pvVar5 + uVar15 * 4) = iVar9;
      uVar8 = uVar16 & 0xffffffff;
      uVar11 = local_60;
      do {
        if (uVar11 == 0xffffffffffffffff) {
          uVar10 = 0;
          break;
        }
        lVar18 = uVar11 + 1;
        uVar13 = uVar11 & 0xffffffff;
        uVar10 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar10;
        uVar11 = uVar11 - 1;
      } while (ppdVar4[uVar13][uVar15] <= ppdVar4[lVar18][uVar15] &&
               ppdVar4[lVar18][uVar15] != ppdVar4[uVar13][uVar15]);
      *(uint *)((long)pvVar6 + uVar15 * 4) = uVar10;
      uVar10 = local_a0;
      if ((int)uVar16 != 0) {
        uVar15 = 0;
        do {
          local_98 = 1;
          if (local_a0 < 2) {
            local_9c = 0;
            dVar19 = INFINITY;
            uVar10 = 0;
          }
          else {
            uVar16 = 0;
            local_9c = 0;
            dVar19 = INFINITY;
            local_78 = uVar15;
            do {
              if (local_98 < local_a0 - 1) {
                pdVar2 = *this->S12P;
                pdVar3 = this->S12P[2];
                local_90 = dVar19;
                theV = Costs::vhat(&cost,this->states + uVar15,&local_98,&local_a0,pdVar2 + local_98
                                   ,pdVar2 + local_a0,pdVar3 + local_98,pdVar3 + local_a0);
                local_94 = Costs::closestStateIndex(&cost,&theV,this->states,(uint)local_80);
                uVar15 = local_78;
                dVar19 = local_90;
              }
              else {
                local_94 = *(uint *)((long)pvVar5 + (ulong)(local_a0 - 1) * 4);
              }
              uVar11 = (ulong)local_98;
              uVar10 = *(uint *)((long)pvVar5 + uVar11 * 4);
              uVar17 = uVar10;
              if (local_94 < uVar10) {
                uVar17 = local_94;
              }
              uVar14 = (uint)uVar15;
              if (uVar14 < uVar17) {
                uVar17 = uVar14;
              }
              uVar12 = *(uint *)((long)pvVar6 + uVar11 * 4);
              if (uVar12 <= local_94) {
                uVar12 = local_94;
              }
              if (uVar14 < uVar12) {
                uVar12 = uVar14;
              }
              uVar14 = local_9c;
              if (uVar17 < uVar12 + 1) {
                uVar8 = (ulong)local_94;
                if (uVar15 < local_94) {
                  uVar8 = uVar15;
                }
                if (uVar10 <= uVar8) {
                  uVar8 = (ulong)uVar10;
                }
                lVar18 = uVar8 * 8;
                do {
                  local_9c = (uint)uVar16;
                  uVar7 = (ulong)((int)uVar7 + 1);
                  local_40 = *(double *)(*(long *)((long)this->Q + lVar18) + uVar11 * 8);
                  ppdVar4 = this->S12P;
                  uVar16 = (ulong)local_a0;
                  local_48 = *ppdVar4 + uVar16;
                  local_90 = dVar19;
                  local_38 = uVar7;
                  dVar19 = Costs::slopeCost(&cost,(double *)((long)this->states + lVar18),
                                            this->states + uVar15,&local_98,&local_a0,
                                            *ppdVar4 + uVar11,local_48,ppdVar4[1] + uVar11,
                                            ppdVar4[1] + uVar16,ppdVar4[2] + uVar11,
                                            ppdVar4[2] + uVar16);
                  dVar19 = dVar19 + local_40 + this->penalty;
                  uVar11 = (ulong)local_98;
                  if (dVar19 < local_90) {
                    uVar14 = local_98;
                  }
                  uVar16 = (ulong)local_9c;
                  if (dVar19 < local_90) {
                    uVar16 = uVar8 & 0xffffffff;
                  }
                  uVar8 = uVar8 + 1;
                  uVar10 = *(uint *)((long)pvVar6 + uVar11 * 4);
                  if (uVar10 <= local_94) {
                    uVar10 = local_94;
                  }
                  if (local_90 <= dVar19) {
                    dVar19 = local_90;
                  }
                  if ((uint)local_78 < uVar10) {
                    uVar10 = (uint)local_78;
                  }
                  lVar18 = lVar18 + 8;
                  uVar15 = local_78;
                } while (uVar8 < uVar10 + 1);
              }
              uVar10 = (uint)uVar16;
              local_98 = local_98 + 1;
              pvVar5 = local_50;
              local_9c = uVar14;
            } while (local_98 < local_a0);
          }
          this->Q[uVar15][local_a0] = dVar19;
          this->lastChpt[uVar15][local_a0] = local_9c;
          this->lastIndState[uVar15][local_a0] = uVar10;
          uVar15 = uVar15 + 1;
          uVar16 = local_80;
          uVar10 = local_a0;
        } while (uVar15 != local_80);
      }
      local_a0 = uVar10 + 1;
    } while (local_a0 < (uint)local_58);
    dVar19 = (double)uVar7 + (double)uVar7;
  }
  this->pruning =
       dVar19 / ((double)((int)local_68 - 1) *
                (double)(local_68 & 0xffffffff) *
                (double)(uVar16 & 0xffffffff) * (double)(uVar16 & 0xffffffff));
  operator_delete__(pvVar5);
  operator_delete__(pvVar6);
  return;
}

Assistant:

void OmegaOP::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  //////////////////////////////////////////////////
  /// CHANNEL INFORMATION
  /// u1 / u2 = "min / max" in each column of Q
  unsigned int* u1 = new unsigned int[n + 1];
  unsigned int* u2 = new unsigned int[n + 1];
  unsigned int theStart;
  unsigned int theEnd;
  double theV = 0;
  unsigned int indexTheV = 0;
  unsigned int nbPosition = 0;

  ///
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    /// FILL u1 and u2 vectors in position T-1
    theStart = 0;
    while(theStart < (p - 1) && Q[theStart][T - 1] > Q[theStart + 1][T - 1])
    {theStart = theStart + 1;}
    u1[T-1] = theStart;
    theEnd = p - 1;
    while(theEnd > 0 && Q[theEnd][T - 1] > Q[theEnd - 1][T - 1])
    {theEnd = theEnd - 1;}
    u2[T-1] = theEnd;

    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        ///// FIND the minimum of the cost in start state
        if(t < (T-1))
        {
          theV = cost.vhat(states[v], t, T, S12P[0][t], S12P[0][T], S12P[2][t], S12P[2][T]);
          indexTheV = cost.closestStateIndex(theV, states, p);
        }
        else
        {
          indexTheV = u1[T-1]; // if t = T-1 cost.slopeCost does not depend on u
        }

        /// explore values (in column of states) with add. constaint u <= v
        for(unsigned int u = std::min(std::min(u1[t],indexTheV), v); u < std::min(std::max(u2[t],indexTheV), v) + 1; u++) /////explore column of states
        {
          nbPosition = nbPosition + 1; //we explore +1 position
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }
      }

      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }

  pruning = 2.0*nbPosition/(1.0*p*p*n*(n-1)); //nbPosition seen / nbPosition total

  delete [] u1;
  u1 = NULL;
  delete [] u2;
  u2 = NULL;
}